

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# option-parser.cc
# Opt level: O2

void __thiscall
wabt::OptionParser::AddOption
          (OptionParser *this,char short_name,char *long_name,char *help,NullCallback *callback)

{
  function<void_()> *this_00;
  undefined1 local_168 [8];
  Option option;
  string local_b8;
  string local_98;
  function<void_()> local_78;
  _Any_data local_58;
  code *local_48;
  code *pcStack_40;
  allocator local_2a;
  allocator local_29;
  
  std::__cxx11::string::string((string *)&option.callback._M_invoker,long_name,&local_2a);
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  local_b8._M_string_length = 0;
  local_b8.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string((string *)&local_98,help,&local_29);
  std::function<void_()>::function(&local_78,callback);
  local_48 = (code *)0x0;
  pcStack_40 = (code *)0x0;
  local_58._M_unused._M_object = (void *)0x0;
  local_58._8_8_ = 0;
  this_00 = (function<void_()> *)operator_new(0x20);
  std::function<void_()>::function(this_00,&local_78);
  pcStack_40 = std::
               _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/wabt/src/option-parser.cc:70:17)>
               ::_M_invoke;
  local_48 = std::
             _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/wabt/src/option-parser.cc:70:17)>
             ::_M_manager;
  local_58._M_unused._M_object = this_00;
  Option::Option((Option *)local_168,short_name,(string *)&option.callback._M_invoker,&local_b8,No,
                 &local_98,(Callback *)&local_58);
  std::_Function_base::~_Function_base((_Function_base *)&local_58);
  std::_Function_base::~_Function_base(&local_78.super__Function_base);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&option.callback._M_invoker);
  std::vector<wabt::OptionParser::Option,std::allocator<wabt::OptionParser::Option>>::
  emplace_back<wabt::OptionParser::Option_const&>
            ((vector<wabt::OptionParser::Option,std::allocator<wabt::OptionParser::Option>> *)
             &this->options_,(Option *)local_168);
  Option::~Option((Option *)local_168);
  return;
}

Assistant:

void OptionParser::AddOption(char short_name,
                             const char* long_name,
                             const char* help,
                             const NullCallback& callback) {
  Option option(short_name, long_name, std::string(), HasArgument::No, help,
                [callback](const char*) { callback(); });
  AddOption(option);
}